

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseDictionaryExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  _Bool _Var1;
  int iVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sourcePosition;
  char *errorMessage;
  size_t sVar6;
  
  iVar2 = sysbvm_parser_lookKindAt(state,0);
  if (iVar2 == 0x1f) {
    startIndex = state->tokenPosition;
    state->tokenPosition = startIndex + 1;
    while (iVar2 = sysbvm_parser_lookKindAt(state,0), iVar2 == 0x18) {
      state->tokenPosition = state->tokenPosition + 1;
    }
    sVar3 = sysbvm_orderedCollection_create(context);
    while (iVar2 = sysbvm_parser_lookKindAt(state,0), iVar2 != 0xe) {
      sVar6 = state->tokenPosition;
      iVar2 = sysbvm_parser_lookKindAt(state,0);
      if (iVar2 == 4) {
        if (state->tokenPosition < state->tokenSequenceSize) {
          sVar4 = sysbvm_arraySlice_at(state->tokenSequence,state->tokenPosition);
        }
        else {
          sVar4 = 0;
        }
        sVar5 = sysbvm_token_getValue(sVar4);
        sVar5 = sysbvm_string_createWithoutSuffix(context,sVar5,":");
        sVar5 = sysbvm_symbol_internFromTuple(context,sVar5);
        sVar4 = sysbvm_token_getSourcePosition(sVar4);
        sVar4 = sysbvm_astLiteralNode_create(context,sVar4,sVar5);
LAB_00124fec:
        state->tokenPosition = state->tokenPosition + 1;
        iVar2 = sysbvm_parser_lookKindAt(state,0);
        sVar5 = 0;
        if (iVar2 != 0x18) {
          iVar2 = sysbvm_parser_lookKindAt(state,0);
          sVar5 = 0;
          if (iVar2 != 0xe) {
            sVar5 = sysbvm_parser_parseCommaExpression(context,state);
          }
        }
        sourcePosition =
             sysbvm_parser_makeSourcePositionForTokenRange
                       (context,state->sourceCode,state->tokenSequence,sVar6,state->tokenPosition);
LAB_0012504a:
        sVar4 = sysbvm_astMakeAssociationNode_create(context,sourcePosition,sVar4,sVar5);
        if (sVar4 == 0) break;
      }
      else {
        sVar4 = sysbvm_parser_parseBinaryExpression(context,state);
        if (sVar4 == 0) break;
        _Var1 = sysbvm_astNode_isErrorNode(context,sVar4);
        if (!_Var1) {
          iVar2 = sysbvm_parser_lookKindAt(state,0);
          if (iVar2 == 0x12) goto LAB_00124fec;
          sourcePosition =
               sysbvm_parser_makeSourcePositionForTokenRange
                         (context,state->sourceCode,state->tokenSequence,sVar6,state->tokenPosition)
          ;
          sVar5 = 0;
          goto LAB_0012504a;
        }
      }
      sysbvm_orderedCollection_add(context,sVar3,sVar4);
      iVar2 = sysbvm_parser_lookKindAt(state,0);
      if ((iVar2 != 0x18) || (_Var1 = sysbvm_astNode_isErrorNode(context,sVar4), _Var1)) break;
      while (iVar2 = sysbvm_parser_lookKindAt(state,0), iVar2 == 0x18) {
        state->tokenPosition = state->tokenPosition + 1;
      }
    }
    sVar3 = sysbvm_orderedCollection_asArray(context,sVar3);
    iVar2 = sysbvm_parser_lookKindAt(state,0);
    if (iVar2 == 0xe) {
      sVar6 = state->tokenPosition + 1;
      state->tokenPosition = sVar6;
      sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,startIndex,sVar6);
      sVar3 = sysbvm_astMakeDictionaryNode_create(context,sVar4,sVar3);
      return sVar3;
    }
    sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    errorMessage = "Expected a right bracket.";
  }
  else {
    sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    errorMessage = "Expected a dictionary start.";
  }
  sVar3 = sysbvm_astErrorNode_createWithCString(context,sVar3,errorMessage);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseDictionaryExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_DICTIONARY_START)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a dictionary start.");

    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t elements = sysbvm_parser_parseDictionaryElements(context, state);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right bracket.");

    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;

    return sysbvm_astMakeDictionaryNode_create(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), elements); 
}